

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_LS.h
# Opt level: O0

void __thiscall fanuc_post_processor::generate_LS::read_pos(generate_LS *this)

{
  RotationBase<Eigen::Quaternion<double,_0>,_3> *this_00;
  size_type sVar1;
  reference pvVar2;
  reference pvVar3;
  reference x;
  reference y;
  reference z;
  Scalar *pSVar4;
  vector<std::array<double,_7UL>,_std::allocator<std::array<double,_7UL>_>_> *this_01;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_d0;
  double local_b0;
  double angle_R;
  double angle_P;
  double angle_W;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> local_50 [8];
  Vector3d eulerAngle;
  Quaterniond quaternion4;
  int i;
  generate_LS *this_local;
  
  quaternion4.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array[3]._4_4_ = 0;
  while( true ) {
    sVar1 = std::vector<std::array<double,_7UL>,_std::allocator<std::array<double,_7UL>_>_>::size
                      (&this->pos_);
    if (sVar1 <= (ulong)(long)quaternion4.m_coeffs.
                              super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
                              .m_data.array[3]._4_4_) break;
    this_01 = &this->pos_;
    pvVar2 = std::vector<std::array<double,_7UL>,_std::allocator<std::array<double,_7UL>_>_>::
             operator[](this_01,(long)quaternion4.m_coeffs.
                                      super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                                      m_storage.m_data.array[3]._4_4_);
    pvVar3 = std::array<double,_7UL>::operator[](pvVar2,6);
    pvVar2 = std::vector<std::array<double,_7UL>,_std::allocator<std::array<double,_7UL>_>_>::
             operator[](this_01,(long)quaternion4.m_coeffs.
                                      super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                                      m_storage.m_data.array[3]._4_4_);
    x = std::array<double,_7UL>::operator[](pvVar2,3);
    pvVar2 = std::vector<std::array<double,_7UL>,_std::allocator<std::array<double,_7UL>_>_>::
             operator[](this_01,(long)quaternion4.m_coeffs.
                                      super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                                      m_storage.m_data.array[3]._4_4_);
    y = std::array<double,_7UL>::operator[](pvVar2,4);
    pvVar2 = std::vector<std::array<double,_7UL>,_std::allocator<std::array<double,_7UL>_>_>::
             operator[](this_01,(long)quaternion4.m_coeffs.
                                      super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                                      m_storage.m_data.array[3]._4_4_);
    z = std::array<double,_7UL>::operator[](pvVar2,5);
    this_00 = (RotationBase<Eigen::Quaternion<double,_0>,_3> *)
              (eulerAngle.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array + 2);
    Eigen::Quaternion<double,_0>::Quaternion((Quaternion<double,_0> *)this_00,pvVar3,x,y,z);
    Eigen::RotationBase<Eigen::Quaternion<double,_0>,_3>::matrix
              ((RotationMatrixType *)&angle_W,this_00);
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::eulerAngles
              ((Matrix<double,_3,_1,_0,_3,_1> *)local_50,
               (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&angle_W,2,1,0);
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[](local_50,2)
    ;
    angle_P = (*pSVar4 / 3.141592653589793) * 180.0;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[](local_50,1)
    ;
    angle_R = (*pSVar4 / 3.141592653589793) * 180.0;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[](local_50,0)
    ;
    local_b0 = (*pSVar4 / 3.141592653589793) * 180.0;
    std::__cxx11::string::append((char *)this);
    std::__cxx11::to_string
              (&local_d0,
               quaternion4.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
               m_storage.m_data.array[3]._4_4_ + 1);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::append((char *)this);
    std::__cxx11::string::append((char *)this);
    std::__cxx11::string::append((char *)this);
    std::__cxx11::string::append((char *)this);
    std::__cxx11::string::append((char *)this);
    std::__cxx11::string::append((char *)this);
    std::__cxx11::string::append((char *)this);
    pvVar2 = std::vector<std::array<double,_7UL>,_std::allocator<std::array<double,_7UL>_>_>::
             operator[](&this->pos_,
                        (long)quaternion4.m_coeffs.
                              super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
                              .m_data.array[3]._4_4_);
    pvVar3 = std::array<double,_7UL>::operator[](pvVar2,0);
    std::__cxx11::to_string(&local_100,*pvVar3);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::append((char *)this);
    pvVar2 = std::vector<std::array<double,_7UL>,_std::allocator<std::array<double,_7UL>_>_>::
             operator[](&this->pos_,
                        (long)quaternion4.m_coeffs.
                              super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
                              .m_data.array[3]._4_4_);
    pvVar3 = std::array<double,_7UL>::operator[](pvVar2,1);
    std::__cxx11::to_string(&local_120,*pvVar3);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::append((char *)this);
    pvVar2 = std::vector<std::array<double,_7UL>,_std::allocator<std::array<double,_7UL>_>_>::
             operator[](&this->pos_,
                        (long)quaternion4.m_coeffs.
                              super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
                              .m_data.array[3]._4_4_);
    pvVar3 = std::array<double,_7UL>::operator[](pvVar2,2);
    std::__cxx11::to_string(&local_140,*pvVar3);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::append((char *)this);
    std::__cxx11::string::append((char *)this);
    std::__cxx11::string::append((char *)this);
    std::__cxx11::to_string(&local_160,angle_P);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::append((char *)this);
    std::__cxx11::to_string(&local_180,angle_R);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::append((char *)this);
    std::__cxx11::to_string(&local_1a0,local_b0);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::append((char *)this);
    std::__cxx11::string::append((char *)this);
    std::__cxx11::string::append((char *)this);
    std::__cxx11::string::append((char *)this);
    quaternion4.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
    m_data.array[3]._4_4_ =
         quaternion4.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
         .m_data.array[3]._4_4_ + 1;
  }
  return;
}

Assistant:

void generate_LS::read_pos() {
        for(int i = 0; i < pos_.size(); i++){
            Eigen::Quaterniond quaternion4(pos_[i][6],pos_[i][3],pos_[i][4],pos_[i][5]);
            Eigen::Vector3d eulerAngle = quaternion4.matrix().eulerAngles(2,1,0); // zyx
            double angle_W = eulerAngle[2]/M_PI*180;
            double angle_P = eulerAngle[1]/M_PI*180;
            double angle_R = eulerAngle[0]/M_PI*180;
            program.append("P[");
            program.append(std::to_string(i+1));
            program.append("]{");
            program.append("\n");
            program.append("   GP1:");
            program.append("\n");
            program.append("\tUF : 0, UT : 1,\t\tCONFIG : 'N U T, 0, 0, 0',");
            program.append("\n");
            program.append("\tX =\t");
            program.append(std::to_string(pos_[i][0]));
            program.append("\tmm,\tY =\t");
            program.append(std::to_string(pos_[i][1]));
            program.append("\tmm,\tZ =\t");
            program.append(std::to_string(pos_[i][2]));
            program.append("\tmm,");
            program.append("\n");
            // *********************** wpr = zyx？ *******************
            program.append("\tW =\t");
            program.append(std::to_string(angle_W));
            program.append("\tdeg,\tP =\t");
            program.append(std::to_string(angle_P));
            program.append("\tdeg,\tR =\t");
            program.append(std::to_string(angle_R));
            program.append("\tdeg");
            program.append("\n");
            program.append("};");
            program.append("\n");
        }

    }